

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_builder.h
# Opt level: O2

MyGame_Example_Any_union_ref_t
MyGame_Example_Any_clone(flatbuffers_builder_t *B,MyGame_Example_Any_union_t u)

{
  uint uVar1;
  int iVar2;
  flatcc_builder_ref_t fVar3;
  uint uVar4;
  uint uVar5;
  MyGame_Example_TestSimpleTableWithEnum_ref_t ref;
  flatbuffers_string_vec_ref_t fVar6;
  MyGame_Example_Alt_ref_t ref_00;
  flatcc_builder_ref_t ref_01;
  flatbuffers_string_ref_t fVar7;
  MyGame_Example_MultipleKeys_ref_t ref_02;
  Fantasy_Movie_ref_t ref_03;
  long lVar8;
  flatcc_builder_ref_t *pfVar9;
  flatcc_builder_utype_t *pfVar10;
  MyGame_Example_MultipleKeys_vec_t vec;
  Fantasy_Rapunzel_vec_t src;
  flatbuffers_string_vec_t vec_00;
  flatbuffers_float_vec_t src_00;
  void *pvVar11;
  Fantasy_Character_union_ref_t FVar12;
  MyGame_Example_MultipleKeys_table_t src_01;
  ushort uVar13;
  ulong uVar14;
  MyGame_Example_Alt_table_t t__tmp;
  Fantasy_Movie_table_t pFVar15;
  ulong uVar16;
  MyGame_Example_Alt_table_t pMVar17;
  size_t sVar18;
  MyGame_Example_Any_union_ref_t MVar19;
  MyGame_Example_Alt_table_t src_02;
  Fantasy_Movie_table_t t__tmp_00;
  MyGame_Example_Any_union_t u_00;
  Fantasy_Character_union_t u_01;
  Fantasy_Character_union_t u_02;
  Fantasy_Character_union_t u_03;
  MyGame_Example_Any_union_vec_t uv__tmp;
  Fantasy_Character_union_t FVar20;
  MyGame_Example_Any_union_t MVar21;
  Fantasy_Character_union_t FVar22;
  Fantasy_Character_union_vec_t uv__tmp_00;
  uint local_3c;
  
  t__tmp = (MyGame_Example_Alt_table_t)u.value;
  switch(u._0_4_ & 0xff) {
  case 1:
    uVar1 = MyGame_Example_Monster_clone(B,(MyGame_Example_Monster_table_t)t__tmp);
    MVar19 = (MyGame_Example_Any_union_ref_t)(((ulong)uVar1 << 0x20) + 1);
    break;
  case 2:
    uVar1 = flatcc_builder_refmap_find(B,t__tmp);
    uVar16 = (ulong)uVar1;
    if (uVar1 == 0) {
      iVar2 = MyGame_Example_TestSimpleTableWithEnum_start(B);
      if (iVar2 == 0) {
        if (t__tmp == (MyGame_Example_Alt_table_t)0x0) {
          __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O2/test/monster_test/generated/monster_test_reader.h"
                        ,0x3ae,
                        "const MyGame_Example_Color_enum_t *MyGame_Example_TestSimpleTableWithEnum_color_get_ptr(MyGame_Example_TestSimpleTableWithEnum_table_t)"
                       );
        }
        uVar13 = *(ushort *)(t__tmp + -(long)*(int *)t__tmp);
        if (5 < uVar13) {
          lVar8 = -(long)*(int *)t__tmp;
          if (*(ushort *)(t__tmp + lVar8 + 4) != 0) {
            uVar16 = 0;
            pvVar11 = flatcc_builder_table_add_copy
                                (B,0,t__tmp + *(ushort *)(t__tmp + lVar8 + 4),1,1);
            if (pvVar11 == (void *)0x0) goto LAB_0010c804;
            lVar8 = -(long)*(int *)t__tmp;
            uVar13 = *(ushort *)(t__tmp + -(long)*(int *)t__tmp);
          }
          if (7 < uVar13) {
            if (*(ushort *)(t__tmp + lVar8 + 6) != 0) {
              pvVar11 = flatcc_builder_table_add_copy
                                  (B,1,t__tmp + *(ushort *)(t__tmp + lVar8 + 6),1,1);
              if (pvVar11 == (void *)0x0) goto LAB_0010c5a7;
              lVar8 = -(long)*(int *)t__tmp;
              uVar13 = *(ushort *)(t__tmp + -(long)*(int *)t__tmp);
            }
            if (9 < uVar13) {
              if (*(ushort *)(t__tmp + lVar8 + 8) != 0) {
                pvVar11 = flatcc_builder_table_add_copy
                                    (B,2,t__tmp + *(ushort *)(t__tmp + lVar8 + 8),1,1);
                if (pvVar11 == (void *)0x0) goto LAB_0010c5a7;
                lVar8 = -(long)*(int *)t__tmp;
                uVar13 = *(ushort *)(t__tmp + -(long)*(int *)t__tmp);
              }
              if ((0xb < uVar13) && (*(ushort *)(t__tmp + lVar8 + 10) != 0)) {
                pvVar11 = flatcc_builder_table_add_copy
                                    (B,3,t__tmp + *(ushort *)(t__tmp + lVar8 + 10),1,1);
                uVar16 = 0;
                if (pvVar11 == (void *)0x0) goto LAB_0010c804;
              }
            }
          }
        }
        ref = MyGame_Example_TestSimpleTableWithEnum_end(B);
        uVar1 = flatcc_builder_refmap_insert(B,t__tmp,ref);
        uVar16 = (ulong)uVar1;
      }
      else {
LAB_0010c5a7:
        uVar16 = 0;
      }
    }
LAB_0010c804:
    MVar19 = (MyGame_Example_Any_union_ref_t)(uVar16 << 0x20 | 2);
    break;
  case 3:
    uVar1 = flatcc_builder_refmap_find(B,t__tmp);
    uVar16 = (ulong)uVar1;
    if (uVar1 == 0) {
      uVar16 = 0;
      iVar2 = flatcc_builder_start_table(B,0);
      if (iVar2 == 0) {
        iVar2 = flatcc_builder_check_required(B,__MyGame_Example2_Monster_required,0);
        if (iVar2 == 0) {
          __assert_fail("flatcc_builder_check_required(B, __MyGame_Example2_Monster_required, sizeof(__MyGame_Example2_Monster_required) / sizeof(__MyGame_Example2_Monster_required[0]) - 1)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O2/test/monster_test/generated/monster_test_builder.h"
                        ,0x108,
                        "MyGame_Example2_Monster_ref_t MyGame_Example2_Monster_end(flatbuffers_builder_t *)"
                       );
        }
        fVar3 = flatcc_builder_end_table(B);
        uVar1 = flatcc_builder_refmap_insert(B,t__tmp,fVar3);
        uVar16 = (ulong)uVar1;
      }
    }
    MVar19 = (MyGame_Example_Any_union_ref_t)(uVar16 << 0x20 | 3);
    break;
  case 4:
    uVar1 = flatcc_builder_refmap_find(B,t__tmp);
    uVar16 = (ulong)uVar1;
    if (uVar1 != 0) goto LAB_0010c574;
    iVar2 = MyGame_Example_Alt_start(B);
    if (iVar2 != 0) goto LAB_0010c571;
    if (t__tmp == (MyGame_Example_Alt_table_t)0x0) {
      __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O2/test/monster_test/generated/monster_test_reader.h"
                    ,0x3d6,
                    "MyGame_Example_TestJSONPrefix_table_t MyGame_Example_Alt_prefix_get(MyGame_Example_Alt_table_t)"
                   );
    }
    lVar8 = -(long)*(int *)t__tmp;
    if ((5 < *(ushort *)(t__tmp + -(long)*(int *)t__tmp)) &&
       (uVar16 = (ulong)*(ushort *)(t__tmp + lVar8 + 4), uVar16 != 0)) {
      src_02 = t__tmp + *(uint *)(t__tmp + uVar16) + uVar16;
      fVar3 = flatcc_builder_refmap_find(B,src_02);
      if (fVar3 != 0) {
LAB_0010c5fa:
        uVar16 = 0;
        pfVar9 = flatcc_builder_table_add_offset(B,0);
        if (pfVar9 == (flatcc_builder_ref_t *)0x0) goto LAB_0010c574;
        *pfVar9 = fVar3;
        lVar8 = -(long)*(int *)t__tmp;
        goto LAB_0010c61a;
      }
      iVar2 = flatcc_builder_start_table(B,3);
      if (iVar2 != 0) goto LAB_0010c571;
      uVar13 = *(ushort *)(src_02 + -(long)*(int *)src_02);
      if (uVar13 < 6) {
LAB_0010cb1c:
        uVar16 = 0;
        iVar2 = flatcc_builder_check_required(B,__MyGame_Example_TestJSONPrefix_required,0);
        if (iVar2 == 0) {
          __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_TestJSONPrefix_required, sizeof(__MyGame_Example_TestJSONPrefix_required) / sizeof(__MyGame_Example_TestJSONPrefix_required[0]) - 1)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O2/test/monster_test/generated/monster_test_builder.h"
                        ,299,
                        "MyGame_Example_TestJSONPrefix_ref_t MyGame_Example_TestJSONPrefix_end(flatbuffers_builder_t *)"
                       );
        }
        fVar3 = flatcc_builder_end_table(B);
        fVar3 = flatcc_builder_refmap_insert(B,src_02,fVar3);
        if (fVar3 == 0) goto LAB_0010c574;
        goto LAB_0010c5fa;
      }
      lVar8 = -(long)*(int *)src_02;
      uVar16 = (ulong)*(ushort *)(src_02 + lVar8 + 4);
      if (uVar16 != 0) {
        pMVar17 = src_02 + *(uint *)(src_02 + uVar16) + uVar16;
        fVar3 = flatcc_builder_refmap_find(B,pMVar17);
        if (fVar3 == 0) {
          iVar2 = flatcc_builder_start_table(B,9);
          if (iVar2 != 0) goto LAB_0010c571;
          lVar8 = -(long)*(int *)pMVar17;
          uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
          if (uVar13 < 0xc) {
LAB_0010ced9:
            if (5 < uVar13) goto LAB_0010cee3;
          }
          else {
            if (*(ushort *)(pMVar17 + lVar8 + 10) != 0) {
              pvVar11 = flatcc_builder_table_add_copy
                                  (B,3,pMVar17 + *(ushort *)(pMVar17 + lVar8 + 10),8,8);
              if (pvVar11 == (void *)0x0) goto LAB_0010c571;
              lVar8 = -(long)*(int *)pMVar17;
              uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
            }
            if (uVar13 < 0x10) goto LAB_0010ced9;
            if (*(ushort *)(pMVar17 + lVar8 + 0xe) != 0) {
              pvVar11 = flatcc_builder_table_add_copy
                                  (B,5,pMVar17 + *(ushort *)(pMVar17 + lVar8 + 0xe),8,8);
              if (pvVar11 == (void *)0x0) goto LAB_0010c571;
              lVar8 = -(long)*(int *)pMVar17;
              uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
            }
            if (uVar13 < 0x14) goto LAB_0010ced9;
            if (*(ushort *)(pMVar17 + lVar8 + 0x12) != 0) {
              pvVar11 = flatcc_builder_table_add_copy
                                  (B,7,pMVar17 + *(ushort *)(pMVar17 + lVar8 + 0x12),8,8);
              if (pvVar11 == (void *)0x0) goto LAB_0010c571;
              lVar8 = -(long)*(int *)pMVar17;
              uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
              goto LAB_0010ced9;
            }
LAB_0010cee3:
            uVar16 = (ulong)*(ushort *)(pMVar17 + lVar8 + 4);
            if (uVar16 != 0) {
              fVar7 = flatbuffers_string_clone
                                (B,(flatbuffers_string_t)
                                   (pMVar17 + *(uint *)(pMVar17 + uVar16) + uVar16 + 4));
              if (fVar7 == 0) goto LAB_0010c571;
              uVar16 = 0;
              pfVar9 = flatcc_builder_table_add_offset(B,0);
              if (pfVar9 == (flatcc_builder_ref_t *)0x0) goto LAB_0010c574;
              *pfVar9 = fVar7;
              lVar8 = -(long)*(int *)pMVar17;
              uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
            }
            if (7 < uVar13) {
              if (*(ushort *)(pMVar17 + lVar8 + 6) != 0) {
                pvVar11 = flatcc_builder_table_add_copy
                                    (B,1,pMVar17 + *(ushort *)(pMVar17 + lVar8 + 6),4,4);
                if (pvVar11 == (void *)0x0) goto LAB_0010c571;
                lVar8 = -(long)*(int *)pMVar17;
                uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
              }
              if (9 < uVar13) {
                uVar16 = (ulong)*(ushort *)(pMVar17 + lVar8 + 8);
                if (uVar16 != 0) {
                  fVar7 = flatbuffers_string_clone
                                    (B,(flatbuffers_string_t)
                                       (pMVar17 + *(uint *)(pMVar17 + uVar16) + uVar16 + 4));
                  if ((fVar7 == 0) ||
                     (pfVar9 = flatcc_builder_table_add_offset(B,2),
                     pfVar9 == (flatcc_builder_ref_t *)0x0)) goto LAB_0010c571;
                  *pfVar9 = fVar7;
                  lVar8 = -(long)*(int *)pMVar17;
                  uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
                }
                if (0xd < uVar13) {
                  uVar16 = (ulong)*(ushort *)(pMVar17 + lVar8 + 0xc);
                  if (uVar16 != 0) {
                    fVar7 = flatbuffers_string_clone
                                      (B,(flatbuffers_string_t)
                                         (pMVar17 + *(uint *)(pMVar17 + uVar16) + uVar16 + 4));
                    if ((fVar7 == 0) ||
                       (pfVar9 = flatcc_builder_table_add_offset(B,4),
                       pfVar9 == (flatcc_builder_ref_t *)0x0)) goto LAB_0010c571;
                    *pfVar9 = fVar7;
                    lVar8 = -(long)*(int *)pMVar17;
                    uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
                  }
                  if (0x11 < uVar13) {
                    if (*(ushort *)(pMVar17 + lVar8 + 0x10) != 0) {
                      pvVar11 = flatcc_builder_table_add_copy
                                          (B,6,pMVar17 + *(ushort *)(pMVar17 + lVar8 + 0x10),4,4);
                      if (pvVar11 == (void *)0x0) goto LAB_0010c571;
                      lVar8 = -(long)*(int *)pMVar17;
                      uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
                    }
                    if (((0x15 < uVar13) && (*(ushort *)(pMVar17 + lVar8 + 0x14) != 0)) &&
                       (pvVar11 = flatcc_builder_table_add_copy
                                            (B,8,pMVar17 + *(ushort *)(pMVar17 + lVar8 + 0x14),4,4),
                       pvVar11 == (void *)0x0)) goto LAB_0010c571;
                  }
                }
              }
            }
          }
          uVar16 = 0;
          iVar2 = flatcc_builder_check_required(B,__MyGame_Example_TestJSONPrefixParsing_required,0)
          ;
          if (iVar2 == 0) {
            __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_TestJSONPrefixParsing_required, sizeof(__MyGame_Example_TestJSONPrefixParsing_required) / sizeof(__MyGame_Example_TestJSONPrefixParsing_required[0]) - 1)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O2/test/monster_test/generated/monster_test_builder.h"
                          ,0x130,
                          "MyGame_Example_TestJSONPrefixParsing_ref_t MyGame_Example_TestJSONPrefixParsing_end(flatbuffers_builder_t *)"
                         );
          }
          fVar3 = flatcc_builder_end_table(B);
          fVar3 = flatcc_builder_refmap_insert(B,pMVar17,fVar3);
          if (fVar3 == 0) goto LAB_0010c574;
        }
        uVar16 = 0;
        pfVar9 = flatcc_builder_table_add_offset(B,0);
        if (pfVar9 == (flatcc_builder_ref_t *)0x0) goto LAB_0010c574;
        *pfVar9 = fVar3;
        lVar8 = -(long)*(int *)src_02;
        uVar13 = *(ushort *)(src_02 + -(long)*(int *)src_02);
      }
      if (uVar13 < 8) goto LAB_0010cb1c;
      uVar16 = (ulong)*(ushort *)(src_02 + lVar8 + 6);
      if (uVar16 != 0) {
        pMVar17 = src_02 + *(uint *)(src_02 + uVar16) + uVar16;
        fVar3 = flatcc_builder_refmap_find(B,pMVar17);
        if (fVar3 == 0) {
          iVar2 = flatcc_builder_start_table(B,2);
          if (iVar2 == 0) {
            uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
            if (5 < uVar13) {
              lVar8 = -(long)*(int *)pMVar17;
              if (*(ushort *)(pMVar17 + lVar8 + 4) != 0) {
                uVar16 = 0;
                pvVar11 = flatcc_builder_table_add_copy
                                    (B,0,pMVar17 + *(ushort *)(pMVar17 + lVar8 + 4),8,8);
                if (pvVar11 == (void *)0x0) goto LAB_0010c574;
                lVar8 = -(long)*(int *)pMVar17;
                uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
              }
              if (((7 < uVar13) && (*(ushort *)(pMVar17 + lVar8 + 6) != 0)) &&
                 (pvVar11 = flatcc_builder_table_add_copy
                                      (B,1,pMVar17 + *(ushort *)(pMVar17 + lVar8 + 6),4,4),
                 pvVar11 == (void *)0x0)) goto LAB_0010c571;
            }
            uVar16 = 0;
            iVar2 = flatcc_builder_check_required
                              (B,__MyGame_Example_TestJSONPrefixParsing2_required,0);
            if (iVar2 == 0) {
              __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_TestJSONPrefixParsing2_required, sizeof(__MyGame_Example_TestJSONPrefixParsing2_required) / sizeof(__MyGame_Example_TestJSONPrefixParsing2_required[0]) - 1)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O2/test/monster_test/generated/monster_test_builder.h"
                            ,0x135,
                            "MyGame_Example_TestJSONPrefixParsing2_ref_t MyGame_Example_TestJSONPrefixParsing2_end(flatbuffers_builder_t *)"
                           );
            }
            fVar3 = flatcc_builder_end_table(B);
            fVar3 = flatcc_builder_refmap_insert(B,pMVar17,fVar3);
            if (fVar3 == 0) goto LAB_0010c574;
            goto LAB_0010caae;
          }
        }
        else {
LAB_0010caae:
          pfVar9 = flatcc_builder_table_add_offset(B,1);
          if (pfVar9 != (flatcc_builder_ref_t *)0x0) {
            *pfVar9 = fVar3;
            lVar8 = -(long)*(int *)src_02;
            uVar13 = *(ushort *)(src_02 + -(long)*(int *)src_02);
            goto LAB_0010cad5;
          }
        }
        goto LAB_0010c571;
      }
LAB_0010cad5:
      if ((uVar13 < 10) || (uVar16 = (ulong)*(ushort *)(src_02 + lVar8 + 8), uVar16 == 0))
      goto LAB_0010cb1c;
      pMVar17 = src_02 + *(uint *)(src_02 + uVar16) + uVar16;
      fVar3 = flatcc_builder_refmap_find(B,pMVar17);
      if (fVar3 == 0) {
        iVar2 = flatcc_builder_start_table(B,2);
        if (iVar2 == 0) {
          uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
          if (5 < uVar13) {
            lVar8 = -(long)*(int *)pMVar17;
            if (*(ushort *)(pMVar17 + lVar8 + 4) != 0) {
              uVar16 = 0;
              pvVar11 = flatcc_builder_table_add_copy
                                  (B,0,pMVar17 + *(ushort *)(pMVar17 + lVar8 + 4),8,8);
              if (pvVar11 == (void *)0x0) goto LAB_0010c574;
              lVar8 = -(long)*(int *)pMVar17;
              uVar13 = *(ushort *)(pMVar17 + -(long)*(int *)pMVar17);
            }
            if (((7 < uVar13) && (*(ushort *)(pMVar17 + lVar8 + 6) != 0)) &&
               (pvVar11 = flatcc_builder_table_add_copy
                                    (B,1,pMVar17 + *(ushort *)(pMVar17 + lVar8 + 6),4,4),
               pvVar11 == (void *)0x0)) goto LAB_0010c571;
          }
          uVar16 = 0;
          iVar2 = flatcc_builder_check_required
                            (B,__MyGame_Example_TestJSONPrefixParsing3_required,0);
          if (iVar2 == 0) {
            __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_TestJSONPrefixParsing3_required, sizeof(__MyGame_Example_TestJSONPrefixParsing3_required) / sizeof(__MyGame_Example_TestJSONPrefixParsing3_required[0]) - 1)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O2/test/monster_test/generated/monster_test_builder.h"
                          ,0x13a,
                          "MyGame_Example_TestJSONPrefixParsing3_ref_t MyGame_Example_TestJSONPrefixParsing3_end(flatbuffers_builder_t *)"
                         );
          }
          fVar3 = flatcc_builder_end_table(B);
          fVar3 = flatcc_builder_refmap_insert(B,pMVar17,fVar3);
          if (fVar3 == 0) goto LAB_0010c574;
          goto LAB_0010cb04;
        }
      }
      else {
LAB_0010cb04:
        pfVar9 = flatcc_builder_table_add_offset(B,2);
        if (pfVar9 != (flatcc_builder_ref_t *)0x0) {
          *pfVar9 = fVar3;
          goto LAB_0010cb1c;
        }
      }
      goto LAB_0010c571;
    }
LAB_0010c61a:
    if ((*(ushort *)(t__tmp + lVar8) < 8) ||
       (uVar16 = (ulong)*(ushort *)(t__tmp + lVar8 + 6), uVar16 == 0)) {
LAB_0010c661:
      uv__tmp = MyGame_Example_Alt_manyany_union(t__tmp);
      pfVar10 = uv__tmp.type;
      if (pfVar10 != (flatcc_builder_utype_t *)0x0) {
        uVar4 = flatcc_builder_refmap_find(B,pfVar10);
        uVar5 = flatcc_builder_refmap_find(B,uv__tmp.value);
        uVar1 = *(uint *)(pfVar10 + -4);
        if (uVar4 == 0) {
          fVar3 = flatcc_builder_create_type_vector(B,pfVar10,(ulong)uVar1);
          uVar4 = flatcc_builder_refmap_insert(B,pfVar10,fVar3);
          if (uVar4 != 0) goto LAB_0010c6c4;
LAB_0010c831:
          uVar14 = 0;
          uVar16 = 0;
        }
        else {
LAB_0010c6c4:
          if (uVar5 == 0) {
            iVar2 = flatcc_builder_start_offset_vector(B);
            if (iVar2 == 0) {
              sVar18 = 0;
              do {
                if (uVar1 == sVar18) {
                  fVar3 = flatcc_builder_end_offset_vector(B);
                  uVar5 = flatcc_builder_refmap_insert(B,uv__tmp.value,fVar3);
                  if (uVar5 != 0) goto LAB_0010c6cc;
                  break;
                }
                MVar21 = MyGame_Example_Any_union_vec_at(uv__tmp,sVar18);
                u_00.value = MVar21.value;
                u_00._1_7_ = 0;
                u_00.type = MVar21.type;
                MVar19 = MyGame_Example_Any_clone(B,u_00);
                if ((ulong)MVar19 >> 0x20 == 0) break;
                pfVar9 = flatcc_builder_offset_vector_push(B,MVar19.value);
                sVar18 = sVar18 + 1;
              } while (pfVar9 != (flatcc_builder_ref_t *)0x0);
            }
            goto LAB_0010c831;
          }
LAB_0010c6cc:
          uVar16 = (ulong)uVar5 << 0x20;
          uVar14 = (ulong)uVar4;
        }
        iVar2 = MyGame_Example_Alt_manyany_add
                          (B,(MyGame_Example_Any_union_vec_ref_t)(uVar14 | uVar16));
        if (iVar2 != 0) goto LAB_0010c571;
      }
      vec = MyGame_Example_Alt_multik_get(t__tmp);
      if (vec != (MyGame_Example_MultipleKeys_vec_t)0x0) {
        fVar3 = flatcc_builder_refmap_find(B,vec);
        if (fVar3 == 0) {
          uVar1 = vec[-1];
          iVar2 = flatcc_builder_start_offset_vector(B);
          if (iVar2 == 0) {
            sVar18 = 0;
            do {
              if (uVar1 == sVar18) {
                fVar3 = flatcc_builder_end_offset_vector(B);
                fVar3 = flatcc_builder_refmap_insert(B,vec,fVar3);
                goto LAB_0010c882;
              }
              src_01 = MyGame_Example_MultipleKeys_vec_at(vec,sVar18);
              ref_01 = flatcc_builder_refmap_find(B,src_01);
              if (ref_01 == 0) {
                iVar2 = MyGame_Example_MultipleKeys_start(B);
                fVar3 = 0;
                if (iVar2 != 0) goto LAB_0010c882;
                if (src_01 == (MyGame_Example_MultipleKeys_table_t)0x0) {
                  __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O2/test/monster_test/generated/monster_test_reader.h"
                                ,0x42d,
                                "const int64_t *MyGame_Example_MultipleKeys_foobar_get_ptr(MyGame_Example_MultipleKeys_table_t)"
                               );
                }
                lVar8 = -(long)*(int *)src_01;
                uVar13 = *(ushort *)(src_01 + -(long)*(int *)src_01);
                if (uVar13 < 10) {
LAB_0010cce0:
                  if (5 < uVar13) goto LAB_0010ccea;
                }
                else {
                  if (*(ushort *)(src_01 + lVar8 + 8) != 0) {
                    pvVar11 = flatcc_builder_table_add_copy
                                        (B,2,src_01 + *(ushort *)(src_01 + lVar8 + 8),8,8);
                    if (pvVar11 != (void *)0x0) {
                      lVar8 = -(long)*(int *)src_01;
                      uVar13 = *(ushort *)(src_01 + -(long)*(int *)src_01);
                      goto LAB_0010cce0;
                    }
                    goto LAB_0010c882;
                  }
LAB_0010ccea:
                  uVar16 = (ulong)*(ushort *)(src_01 + lVar8 + 4);
                  if (uVar16 != 0) {
                    fVar7 = flatbuffers_string_clone
                                      (B,(flatbuffers_string_t)
                                         (src_01 + *(uint *)(src_01 + uVar16) + uVar16 + 4));
                    iVar2 = MyGame_Example_MultipleKeys_hello_add(B,fVar7);
                    if (iVar2 != 0) goto LAB_0010c882;
                    lVar8 = -(long)*(int *)src_01;
                    uVar13 = *(ushort *)(src_01 + -(long)*(int *)src_01);
                  }
                  if ((7 < uVar13) && (uVar16 = (ulong)*(ushort *)(src_01 + lVar8 + 6), uVar16 != 0)
                     ) {
                    fVar7 = flatbuffers_string_clone
                                      (B,(flatbuffers_string_t)
                                         (src_01 + *(uint *)(src_01 + uVar16) + uVar16 + 4));
                    iVar2 = MyGame_Example_MultipleKeys_world_add(B,fVar7);
                    if (iVar2 != 0) goto LAB_0010c882;
                  }
                }
                ref_02 = MyGame_Example_MultipleKeys_end(B);
                ref_01 = flatcc_builder_refmap_insert(B,src_01,ref_02);
                if (ref_01 == 0) goto LAB_0010c882;
              }
              pfVar9 = flatcc_builder_offset_vector_push(B,ref_01);
              sVar18 = sVar18 + 1;
            } while (pfVar9 != (flatcc_builder_ref_t *)0x0);
          }
          fVar3 = 0;
        }
LAB_0010c882:
        iVar2 = MyGame_Example_Alt_multik_add(B,fVar3);
        if (iVar2 != 0) goto LAB_0010c571;
      }
      src = MyGame_Example_Alt_rapunzels_get(t__tmp);
      if (src != (Fantasy_Rapunzel_vec_t)0x0) {
        fVar3 = flatcc_builder_refmap_find(B,src);
        if (fVar3 == 0) {
          fVar3 = flatcc_builder_create_vector
                            (B,src,(ulong)*(uint *)src[-1].__deprecated0,8,4,0x1fffffff);
          fVar3 = flatcc_builder_refmap_insert(B,src,fVar3);
          if (fVar3 == 0) goto LAB_0010c571;
        }
        pfVar9 = flatcc_builder_table_add_offset(B,5);
        if (pfVar9 == (flatcc_builder_ref_t *)0x0) goto LAB_0010c571;
        *pfVar9 = fVar3;
      }
      vec_00 = MyGame_Example_Alt_names_get(t__tmp);
      if (vec_00 != (flatbuffers_string_vec_t)0x0) {
        fVar6 = flatbuffers_string_vec_clone(B,vec_00);
        if ((fVar6 == 0) ||
           (pfVar9 = flatcc_builder_table_add_offset(B,6), pfVar9 == (flatcc_builder_ref_t *)0x0))
        goto LAB_0010c571;
        *pfVar9 = fVar6;
      }
      src_00 = MyGame_Example_Alt_samples_get(t__tmp);
      if (src_00 != (flatbuffers_float_vec_t)0x0) {
        fVar3 = flatcc_builder_refmap_find(B,src_00);
        if (fVar3 == 0) {
          fVar3 = flatcc_builder_create_vector(B,src_00,(ulong)(uint)src_00[-1],4,4,0x3fffffff);
          fVar3 = flatcc_builder_refmap_insert(B,src_00,fVar3);
          if (fVar3 == 0) goto LAB_0010c571;
        }
        pfVar9 = flatcc_builder_table_add_offset(B,7);
        if (pfVar9 == (flatcc_builder_ref_t *)0x0) goto LAB_0010c571;
        *pfVar9 = fVar3;
      }
      if ((0x15 < *(ushort *)(t__tmp + -(long)*(int *)t__tmp)) &&
         (*(ushort *)(t__tmp + (0x14 - (long)*(int *)t__tmp)) != 0)) {
        pvVar11 = flatcc_builder_table_add_copy
                            (B,8,t__tmp + *(ushort *)(t__tmp + (0x14 - (long)*(int *)t__tmp)),0x7c,4
                            );
        uVar16 = 0;
        if (pvVar11 == (void *)0x0) goto LAB_0010c574;
      }
      ref_00 = MyGame_Example_Alt_end(B);
      uVar1 = flatcc_builder_refmap_insert(B,t__tmp,ref_00);
      uVar16 = (ulong)uVar1;
    }
    else {
      t__tmp_00 = (Fantasy_Movie_table_t)(t__tmp + *(uint *)(t__tmp + uVar16) + uVar16);
      fVar3 = flatcc_builder_refmap_find(B,t__tmp_00);
      if (fVar3 == 0) {
        iVar2 = Fantasy_Movie_start(B);
        if (iVar2 == 0) {
          FVar20 = Fantasy_Movie_main_character_union(t__tmp_00);
          FVar22.value = FVar20.value;
          if (FVar20.type != 0) {
            FVar22._1_7_ = 0;
            FVar22.type = FVar20.type;
            FVar12 = Fantasy_Character_clone(B,FVar22);
            iVar2 = Fantasy_Movie_main_character_add(B,FVar12);
            if (iVar2 != 0) goto LAB_0010c571;
          }
          if (9 < *(ushort *)(t__tmp_00 + -(long)*(int *)t__tmp_00)) {
            lVar8 = -(long)*(int *)t__tmp_00;
            if (((ulong)*(ushort *)(t__tmp_00 + lVar8 + 8) != 0) &&
               (t__tmp_00[*(ushort *)(t__tmp_00 + lVar8 + 8)].unused__ != 0)) {
              uVar16 = 0;
              if ((*(ushort *)(t__tmp_00 + -(long)*(int *)t__tmp_00) < 0xc) ||
                 (uVar14 = (ulong)*(ushort *)(t__tmp_00 + lVar8 + 10), uVar14 == 0)) {
                pFVar15 = (Fantasy_Movie_table_t)0x0;
              }
              else {
                pFVar15 = t__tmp_00 + *(uint *)(t__tmp_00 + uVar14) + uVar14;
              }
              FVar20._1_7_ = 0;
              FVar20.type = t__tmp_00[*(ushort *)(t__tmp_00 + lVar8 + 8)].unused__;
              FVar20.value = pFVar15;
              FVar12 = Fantasy_Character_clone(B,FVar20);
              iVar2 = Fantasy_Movie_antagonist_add(B,FVar12);
              if (iVar2 != 0) goto LAB_0010c574;
            }
          }
          FVar22 = Fantasy_Movie_side_kick_union(t__tmp_00);
          u_01.value = FVar22.value;
          if (FVar22.type != 0) {
            u_01._1_7_ = 0;
            u_01.type = FVar22.type;
            FVar12 = Fantasy_Character_clone(B,u_01);
            iVar2 = Fantasy_Movie_side_kick_add(B,FVar12);
            if (iVar2 != 0) goto LAB_0010c571;
          }
          if (0x11 < *(ushort *)(t__tmp_00 + -(long)*(int *)t__tmp_00)) {
            lVar8 = -(long)*(int *)t__tmp_00;
            if (((ulong)*(ushort *)(t__tmp_00 + lVar8 + 0x10) != 0) &&
               (t__tmp_00[*(ushort *)(t__tmp_00 + lVar8 + 0x10)].unused__ != 0)) {
              uVar16 = 0;
              if ((*(ushort *)(t__tmp_00 + -(long)*(int *)t__tmp_00) < 0x14) ||
                 (uVar14 = (ulong)*(ushort *)(t__tmp_00 + lVar8 + 0x12), uVar14 == 0)) {
                pFVar15 = (Fantasy_Movie_table_t)0x0;
              }
              else {
                pFVar15 = t__tmp_00 + *(uint *)(t__tmp_00 + uVar14) + uVar14;
              }
              u_02._1_7_ = 0;
              u_02.type = t__tmp_00[*(ushort *)(t__tmp_00 + lVar8 + 0x10)].unused__;
              u_02.value = pFVar15;
              FVar12 = Fantasy_Character_clone(B,u_02);
              iVar2 = Fantasy_Movie_cameo_add(B,FVar12);
              if (iVar2 != 0) goto LAB_0010c574;
            }
          }
          uv__tmp_00 = Fantasy_Movie_characters_union(t__tmp_00);
          pfVar10 = uv__tmp_00.type;
          if (pfVar10 != (flatcc_builder_utype_t *)0x0) {
            local_3c = flatcc_builder_refmap_find(B,pfVar10);
            uVar4 = flatcc_builder_refmap_find(B,uv__tmp_00.value);
            uVar1 = *(uint *)(pfVar10 + -4);
            if (local_3c == 0) {
              fVar3 = flatcc_builder_create_type_vector(B,pfVar10,(ulong)uVar1);
              local_3c = flatcc_builder_refmap_insert(B,pfVar10,fVar3);
              if (local_3c != 0) goto LAB_0010d2fe;
LAB_0010d31a:
              uVar14 = 0;
              uVar16 = 0;
            }
            else {
LAB_0010d2fe:
              if (uVar4 == 0) {
                iVar2 = flatcc_builder_start_offset_vector(B);
                if (iVar2 == 0) {
                  sVar18 = 0;
                  do {
                    if (uVar1 == sVar18) {
                      fVar3 = flatcc_builder_end_offset_vector(B);
                      uVar4 = flatcc_builder_refmap_insert(B,uv__tmp_00.value,fVar3);
                      if (uVar4 != 0) goto LAB_0010d302;
                      break;
                    }
                    FVar22 = Fantasy_Character_union_vec_at(uv__tmp_00,sVar18);
                    u_03.value = FVar22.value;
                    u_03._1_7_ = 0;
                    u_03.type = FVar22.type;
                    FVar12 = Fantasy_Character_clone(B,u_03);
                    if ((ulong)FVar12 >> 0x20 == 0) break;
                    pfVar9 = flatcc_builder_offset_vector_push(B,FVar12.value);
                    sVar18 = sVar18 + 1;
                  } while (pfVar9 != (flatcc_builder_ref_t *)0x0);
                }
                goto LAB_0010d31a;
              }
LAB_0010d302:
              uVar16 = (ulong)uVar4 << 0x20;
              uVar14 = (ulong)local_3c;
            }
            iVar2 = Fantasy_Movie_characters_add
                              (B,(Fantasy_Character_union_vec_ref_t)(uVar14 | uVar16));
            if (iVar2 != 0) goto LAB_0010c571;
          }
          ref_03 = Fantasy_Movie_end(B);
          fVar3 = flatcc_builder_refmap_insert(B,t__tmp_00,ref_03);
          if (fVar3 != 0) goto LAB_0010c649;
        }
      }
      else {
LAB_0010c649:
        pfVar9 = flatcc_builder_table_add_offset(B,1);
        if (pfVar9 != (flatcc_builder_ref_t *)0x0) {
          *pfVar9 = fVar3;
          goto LAB_0010c661;
        }
      }
LAB_0010c571:
      uVar16 = 0;
    }
LAB_0010c574:
    MVar19 = (MyGame_Example_Any_union_ref_t)(uVar16 << 0x20 | 4);
    break;
  default:
    MVar19.type = '\0';
    MVar19._1_3_ = 0;
    MVar19.value = 0;
  }
  return MVar19;
}

Assistant:

static MyGame_Example_Any_union_ref_t MyGame_Example_Any_clone(flatbuffers_builder_t *B, MyGame_Example_Any_union_t u)
{
    switch (u.type) {
    case 1: return MyGame_Example_Any_as_Monster(MyGame_Example_Monster_clone(B, (MyGame_Example_Monster_table_t)u.value));
    case 2: return MyGame_Example_Any_as_TestSimpleTableWithEnum(MyGame_Example_TestSimpleTableWithEnum_clone(B, (MyGame_Example_TestSimpleTableWithEnum_table_t)u.value));
    case 3: return MyGame_Example_Any_as_Monster2(MyGame_Example2_Monster_clone(B, (MyGame_Example2_Monster_table_t)u.value));
    case 4: return MyGame_Example_Any_as_Alt(MyGame_Example_Alt_clone(B, (MyGame_Example_Alt_table_t)u.value));
    default: return MyGame_Example_Any_as_NONE();
    }
}